

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

void __thiscall f8n::prefs::Preferences::Load(Preferences *this)

{
  FILE *__stream;
  ulong __size;
  void *__ptr;
  bool in_DL;
  allocator<char> local_149;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [2];
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  string local_68;
  char *local_48 [4];
  
  env::GetDataDirectory_abi_cxx11_(&local_68,(env *)0x1,in_DL);
  std::operator+(&local_e8,&local_68,"/");
  std::operator+(local_c8,&local_e8,&this->component);
  std::operator+(&local_128,local_c8,".json");
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  if (local_128._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"rb",&local_149);
    __stream = fopen(local_128._M_dataplus._M_p,local_48[0]);
    std::__cxx11::string::~string((string *)local_48);
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      rewind(__stream);
      if (0 < (long)__size) {
        __ptr = operator_new__(__size);
        fread(__ptr,__size,1,__stream);
        std::__cxx11::string::assign((char *)&str,(ulong)__ptr);
        operator_delete__(__ptr);
      }
      fclose(__stream);
    }
  }
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  if (str._M_string_length != 0) {
    local_78 = 0;
    uStack_70 = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::parse<std::__cxx11::string&>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_f8,&str,(parser_callback_t *)&local_88,true,false);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->json,&local_f8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
  }
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void Preferences::Load() {
    std::string str = fileToString(FILENAME(this->component));
    if (str.size()) {
        try {
            this->json = json::parse(str);
        }
        catch (...) {
            std::cerr << "error loading " << this->component << ".json";
            this->json = json::parse("{ }");
        }
    }
}